

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

size_t json_array_get_string_len(JSON_Array *array,size_t index)

{
  JSON_Value *value;
  size_t sVar1;
  size_t index_local;
  JSON_Array *array_local;
  
  value = json_array_get_value(array,index);
  sVar1 = json_value_get_string_len(value);
  return sVar1;
}

Assistant:

size_t json_array_get_string_len(const JSON_Array *array, size_t index) {
    return json_value_get_string_len(json_array_get_value(array, index));
}